

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::LabelEncoderTest_empty_Test::TestBody(LabelEncoderTest_empty_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0;
  Message local_98 [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LabelEncoderTest_empty_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[1],_true>
            (&local_80,(char (*) [12])"first_label",(char (*) [1])0x171c1c);
  LabelEncoderTest::Encode(&local_40,&this->super_LabelEncoderTest,&local_80);
  testing::internal::EqHelper::
  Compare<char[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,"\"/first_label@base64/=\"","Encode(Label{\"first_label\", \"\"})"
             ,(char (*) [22])"/first_label@base64/=",&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/tests/internal/label_encoder_test.cc"
               ,0x1b,message);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(LabelEncoderTest, empty) {
  EXPECT_EQ("/first_label@base64/=", Encode(Label{"first_label", ""}));
}